

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  UnknownFieldSet *debug_msg_name_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  UnknownField *pUVar5;
  reference ppFVar6;
  string *psVar7;
  UnknownFieldSet *unknown_fields_00;
  LogMessage *pLVar8;
  byte local_15a;
  LogFinisher local_121;
  LogMessage local_120;
  const_iterator local_e8;
  const_iterator local_e0;
  uint local_d4;
  OptionInterpreter *local_d0;
  FieldDescriptor **local_c8;
  undefined1 local_c0 [8];
  UnknownFieldSet intermediate_unknown_fields;
  Type type;
  UnknownField *unknown_field;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_44;
  UnknownFieldSet *pUStack_40;
  int i;
  UnknownFieldSet *unknown_fields_local;
  string *debug_msg_name_local;
  FieldDescriptor *innermost_field_local;
  OptionInterpreter *this_local;
  const_iterator intermediate_fields_end_local;
  const_iterator intermediate_fields_iter_local;
  
  pUStack_40 = unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)debug_msg_name;
  debug_msg_name_local = (string *)innermost_field;
  innermost_field_local = (FieldDescriptor *)this;
  this_local = (OptionInterpreter *)intermediate_fields_end._M_current;
  intermediate_fields_end_local = intermediate_fields_iter;
  bVar1 = __gnu_cxx::operator==
                    (&intermediate_fields_end_local,
                     (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                      *)&this_local);
  if (bVar1) {
    for (local_44 = 0; iVar2 = local_44, iVar3 = UnknownFieldSet::field_count(pUStack_40),
        iVar2 < iVar3; local_44 = local_44 + 1) {
      pUVar5 = UnknownFieldSet::field(pUStack_40,local_44);
      iVar2 = UnknownField::number(pUVar5);
      iVar3 = FieldDescriptor::number((FieldDescriptor *)debug_msg_name_local);
      if (iVar2 == iVar3) {
        std::operator+(&local_88,"Option \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       unknown_fields_local);
        std::operator+(&local_68,&local_88,"\" was already set.");
        intermediate_fields_iter_local._M_current._7_1_ = AddNameError(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        goto LAB_00669310;
      }
    }
    intermediate_fields_iter_local._M_current._7_1_ = 1;
  }
  else {
    for (unknown_field._0_4_ = 0; iVar2 = UnknownFieldSet::field_count(pUStack_40),
        (int)unknown_field < iVar2; unknown_field._0_4_ = (int)unknown_field + 1) {
      pUVar5 = UnknownFieldSet::field(pUStack_40,(int)unknown_field);
      iVar2 = UnknownField::number(pUVar5);
      ppFVar6 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&intermediate_fields_end_local);
      iVar3 = FieldDescriptor::number(*ppFVar6);
      if (iVar2 == iVar3) {
        pUVar5 = UnknownFieldSet::field(pUStack_40,(int)unknown_field);
        ppFVar6 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator*(&intermediate_fields_end_local);
        intermediate_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = FieldDescriptor::type(*ppFVar6);
        if (intermediate_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == TYPE_GROUP) {
          TVar4 = UnknownField::type(pUVar5);
          if (TVar4 == TYPE_GROUP) {
            local_e0._M_current =
                 (FieldDescriptor **)
                 __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                 ::operator+(&intermediate_fields_end_local,1);
            psVar7 = debug_msg_name_local;
            debug_msg_name_00 = unknown_fields_local;
            local_e8._M_current = (FieldDescriptor **)this_local;
            unknown_fields_00 = UnknownField::group(pUVar5);
            bVar1 = ExamineIfOptionIsSet
                              (this,local_e0,local_e8,(FieldDescriptor *)psVar7,
                               (string *)debug_msg_name_00,unknown_fields_00);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              intermediate_fields_iter_local._M_current._7_1_ = 0;
              goto LAB_00669310;
            }
          }
        }
        else {
          if (intermediate_unknown_fields.fields_.
              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != TYPE_MESSAGE) {
            internal::LogMessage::LogMessage
                      (&local_120,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1cf9);
            pLVar8 = internal::LogMessage::operator<<
                               (&local_120,"Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar8 = internal::LogMessage::operator<<
                               (pLVar8,intermediate_unknown_fields.fields_.
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            internal::LogFinisher::operator=(&local_121,pLVar8);
            internal::LogMessage::~LogMessage(&local_120);
            intermediate_fields_iter_local._M_current._7_1_ = 0;
            goto LAB_00669310;
          }
          TVar4 = UnknownField::type(pUVar5);
          if (TVar4 == TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)local_c0);
            psVar7 = UnknownField::length_delimited_abi_cxx11_(pUVar5);
            bVar1 = UnknownFieldSet::ParseFromString((UnknownFieldSet *)local_c0,psVar7);
            local_15a = 0;
            if (bVar1) {
              local_c8 = (FieldDescriptor **)
                         __gnu_cxx::
                         __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                         ::operator+(&intermediate_fields_end_local,1);
              local_d0 = this_local;
              bVar1 = ExamineIfOptionIsSet
                                (this,(const_iterator)local_c8,(const_iterator)this_local,
                                 (FieldDescriptor *)debug_msg_name_local,
                                 (string *)unknown_fields_local,(UnknownFieldSet *)local_c0);
              local_15a = bVar1 ^ 0xff;
            }
            bVar1 = (local_15a & 1) != 0;
            if (bVar1) {
              intermediate_fields_iter_local._M_current._7_1_ = 0;
            }
            local_d4 = (uint)bVar1;
            UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_c0);
            if (local_d4 != 0) goto LAB_00669310;
          }
        }
      }
    }
    intermediate_fields_iter_local._M_current._7_1_ = 1;
  }
LAB_00669310:
  return (bool)(intermediate_fields_iter_local._M_current._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}